

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseBandwidth.cpp
# Opt level: O0

void __thiscall
tonk::ReceiverBandwidthControl::UpdateSendShape
          (ReceiverBandwidthControl *this,uint64_t nowUsec,uint smoothedSendDelayUsec)

{
  Decision DVar1;
  long in_RDI;
  Decision decision;
  uint in_stack_0000004c;
  uint64_t in_stack_00000050;
  ReceiverBandwidthControl *in_stack_00000058;
  
  DVar1 = UpdateCC(in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  if (*(uint *)(in_RDI + 0xa0) < 1000) {
    *(undefined4 *)(in_RDI + 0xa0) = 1000;
  }
  *(float *)(in_RDI + 0xa4) = *(float *)(in_RDI + 0x28) * 2.0;
  if (DVar1 == PushUpdateInAck) {
    *(undefined1 *)(in_RDI + 0xa8) = 1;
  }
  return;
}

Assistant:

void ReceiverBandwidthControl::UpdateSendShape(
    uint64_t nowUsec,
    unsigned smoothedSendDelayUsec)
{
    // If delay feedback has not been received, use our own estimate
    if (smoothedSendDelayUsec <= 0) {
        smoothedSendDelayUsec = Bandwidth.Measurement.SmoothedMaxTripUsec;
    }

    // Update CC
    const Decision decision = UpdateCC(nowUsec, smoothedSendDelayUsec);

    // Minimum BPS
    if (NextShape.AppBPS < protocol::kMinimumBytesPerSecond) {
        NextShape.AppBPS = protocol::kMinimumBytesPerSecond;
    }

    // Send FEC datagrams proportional to the loss rate
    NextShape.FECRate = Bandwidth.Measurement.SmoothedPLR * 2.f;

    if (decision == Decision::PushUpdateInAck) {
        // Ask connection timer tick to send an ACK with our new bandwidth shape
        ShouldAckFast = true;
    }
}